

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_25::GoCodeGenerator::~GoCodeGenerator(GoCodeGenerator *this)

{
  GoCodeGenerator *this_local;
  
  ~GoCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateGo(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }